

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O2

void __thiscall
avro::json::JsonGenerator::encodeBinary(JsonGenerator *this,uint8_t *bytes,size_t len)

{
  size_t in_RCX;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  size_t sVar1;
  
  sep(this);
  StreamWriter::write(&this->out_,0x22,__buf,in_RCX);
  __buf_00 = extraout_RDX;
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    escapeCtl(this,bytes[sVar1]);
    __buf_00 = extraout_RDX_00;
  }
  StreamWriter::write(&this->out_,0x22,__buf_00,in_RCX);
  if (this->top == stKey) {
    this->top = stMapN;
  }
  return;
}

Assistant:

void encodeBinary(const uint8_t* bytes, size_t len) {
        sep();
        out_.write('"');
        const uint8_t* e = bytes + len;
        while (bytes != e) {
            escapeCtl(*bytes++);
        }
        out_.write('"');
        sep2();
    }